

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::javanano::FileClassName_abi_cxx11_
          (string *__return_storage_ptr__,javanano *this,Params *params,FileDescriptor *file)

{
  bool bVar1;
  string *psVar2;
  string local_98;
  string local_78 [48];
  long local_48;
  size_type last_slash;
  string basename;
  FileDescriptor *file_local;
  Params *params_local;
  
  basename.field_2._8_8_ = params;
  psVar2 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)params);
  bVar1 = Params::has_java_outer_classname((Params *)this,psVar2);
  if (bVar1) {
    psVar2 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)basename.field_2._8_8_);
    psVar2 = Params::java_outer_classname((Params *)this,psVar2);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
  }
  else {
    std::__cxx11::string::string((string *)&last_slash);
    psVar2 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)basename.field_2._8_8_);
    local_48 = std::__cxx11::string::find_last_of((char)psVar2,0x2f);
    if (local_48 == -1) {
      psVar2 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)basename.field_2._8_8_);
      std::__cxx11::string::operator=((string *)&last_slash,(string *)psVar2);
    }
    else {
      psVar2 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)basename.field_2._8_8_);
      std::__cxx11::string::substr((ulong)local_78,(ulong)psVar2);
      std::__cxx11::string::operator=((string *)&last_slash,local_78);
      std::__cxx11::string::~string(local_78);
    }
    StripProto(&local_98,(string *)&last_slash);
    anon_unknown_1::UnderscoresToCamelCaseImpl(__return_storage_ptr__,&local_98,true);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&last_slash);
  }
  return __return_storage_ptr__;
}

Assistant:

string FileClassName(const Params& params, const FileDescriptor* file) {
  if (params.has_java_outer_classname(file->name())) {
    return params.java_outer_classname(file->name());
  } else {
    // Use the filename itself with underscores removed
    // and a CamelCase style name.
    string basename;
    string::size_type last_slash = file->name().find_last_of('/');
    if (last_slash == string::npos) {
      basename = file->name();
    } else {
      basename = file->name().substr(last_slash + 1);
    }
    return UnderscoresToCamelCaseImpl(StripProto(basename), true);
  }
}